

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.c
# Opt level: O0

exr_result_t
exr_write_deep_tile_chunk
          (exr_context_t ctxt,int part_index,int tilex,int tiley,int levelx,int levely,
          void *packed_data,uint64_t packed_size,uint64_t unpacked_size,void *sample_data,
          uint64_t sample_data_size)

{
  undefined8 unaff_RBX;
  undefined8 unaff_RBP;
  int part_index_00;
  uint in_ESI;
  _internal_exr_context *in_RDI;
  _internal_exr_part *unaff_R14;
  _internal_exr_context *unaff_retaddr;
  int in_stack_00000020;
  void *in_stack_00000028;
  uint64_t in_stack_00000030;
  _internal_exr_part *part;
  _internal_exr_context *pctxt;
  exr_result_t rv;
  int in_stack_ffffffffffffffe4;
  exr_result_t eVar1;
  
  part_index_00 = (int)((ulong)unaff_RBP >> 0x20);
  if (in_RDI == (_internal_exr_context *)0x0) {
    eVar1 = 2;
  }
  else {
    internal_exr_lock(in_RDI);
    if (((int)in_ESI < 0) || (in_RDI->num_parts <= (int)in_ESI)) {
      internal_exr_unlock(in_RDI);
      eVar1 = (*in_RDI->print_error)(in_RDI,4,"Part index (%d) out of range",(ulong)in_ESI);
    }
    else if (in_RDI->parts[(int)in_ESI]->storage_mode == EXR_STORAGE_TILED) {
      internal_exr_unlock(in_RDI);
      eVar1 = (*in_RDI->standard_error)(in_RDI,0x1d);
    }
    else {
      eVar1 = write_tile_chunk(unaff_retaddr,part_index_00,unaff_R14,(int)((ulong)unaff_RBX >> 0x20)
                               ,(int)unaff_RBX,in_stack_ffffffffffffffe4,in_stack_00000020,
                               in_stack_00000028,in_stack_00000030,(uint64_t)part,pctxt,
                               CONCAT44(levely,rv));
      internal_exr_unlock(in_RDI);
    }
  }
  return eVar1;
}

Assistant:

exr_result_t
exr_write_deep_tile_chunk (
    exr_context_t ctxt,
    int           part_index,
    int           tilex,
    int           tiley,
    int           levelx,
    int           levely,
    const void*   packed_data,
    uint64_t      packed_size,
    uint64_t      unpacked_size,
    const void*   sample_data,
    uint64_t      sample_data_size)
{
    exr_result_t rv;
    EXR_PROMOTE_LOCKED_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);

    if (part->storage_mode == EXR_STORAGE_TILED)
        return EXR_UNLOCK_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_USE_TILE_NONDEEP_WRITE));

    rv = write_tile_chunk (
        pctxt,
        part_index,
        part,
        tilex,
        tiley,
        levelx,
        levely,
        packed_data,
        packed_size,
        unpacked_size,
        sample_data,
        sample_data_size);
    return EXR_UNLOCK_AND_RETURN_PCTXT (rv);
}